

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

VersionEdit * __thiscall leveldb::VersionEdit::DebugString_abi_cxx11_(VersionEdit *this)

{
  FileMetaData *pFVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  FileMetaData *pFVar6;
  const_reference pvVar7;
  long in_RSI;
  InternalKey local_c8;
  InternalKey local_a8;
  FileMetaData *local_88;
  FileMetaData *f;
  size_t i_1;
  pair<int,_unsigned_long> *deleted_files_kvp;
  iterator __end1;
  iterator __begin1;
  DeletedFileSet *__range1;
  ulong local_38;
  size_t i;
  undefined1 local_19;
  VersionEdit *this_local;
  string *r;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::append((char *)this);
  if ((*(byte *)(in_RSI + 0x40) & 1) != 0) {
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((string *)this);
  }
  if ((*(byte *)(in_RSI + 0x41) & 1) != 0) {
    std::__cxx11::string::append((char *)this);
    AppendNumberTo(&this->comparator_,*(uint64_t *)(in_RSI + 0x20));
  }
  if ((*(byte *)(in_RSI + 0x42) & 1) != 0) {
    std::__cxx11::string::append((char *)this);
    AppendNumberTo(&this->comparator_,*(uint64_t *)(in_RSI + 0x28));
  }
  if ((*(byte *)(in_RSI + 0x43) & 1) != 0) {
    std::__cxx11::string::append((char *)this);
    AppendNumberTo(&this->comparator_,*(uint64_t *)(in_RSI + 0x30));
  }
  if ((*(byte *)(in_RSI + 0x44) & 1) != 0) {
    std::__cxx11::string::append((char *)this);
    AppendNumberTo(&this->comparator_,*(uint64_t *)(in_RSI + 0x38));
  }
  for (local_38 = 0; uVar2 = local_38,
      sVar4 = std::
              vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
              ::size((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                      *)(in_RSI + 0x48)), uVar2 < sVar4; local_38 = local_38 + 1) {
    std::__cxx11::string::append((char *)this);
    pvVar5 = std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                           *)(in_RSI + 0x48),local_38);
    AppendNumberTo(&this->comparator_,(long)pvVar5->first);
    std::__cxx11::string::append((char *)this);
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)(in_RSI + 0x48),local_38);
    InternalKey::DebugString_abi_cxx11_((InternalKey *)&__range1);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&__range1);
  }
  __end1 = std::
           set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           ::begin((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
                    *)(in_RSI + 0x60));
  deleted_files_kvp =
       (pair<int,_unsigned_long> *)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::end((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
              *)(in_RSI + 0x60));
  while (bVar3 = std::operator!=(&__end1,(_Self *)&deleted_files_kvp), bVar3) {
    i_1 = (size_t)std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*(&__end1);
    std::__cxx11::string::append((char *)this);
    AppendNumberTo(&this->comparator_,(long)*(int *)i_1);
    std::__cxx11::string::append((char *)this);
    AppendNumberTo(&this->comparator_,*(uint64_t *)(i_1 + 8));
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++(&__end1);
  }
  for (f = (FileMetaData *)0x0; pFVar1 = f,
      pFVar6 = (FileMetaData *)
               std::
               vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ::size((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                       *)(in_RSI + 0x90)), pFVar1 < pFVar6; f = (FileMetaData *)((long)&f->refs + 1)
      ) {
    pvVar7 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                           *)(in_RSI + 0x90),(size_type)f);
    local_88 = &pvVar7->second;
    std::__cxx11::string::append((char *)this);
    pvVar7 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                           *)(in_RSI + 0x90),(size_type)f);
    AppendNumberTo(&this->comparator_,(long)pvVar7->first);
    std::__cxx11::string::append((char *)this);
    AppendNumberTo(&this->comparator_,local_88->number);
    std::__cxx11::string::append((char *)this);
    AppendNumberTo(&this->comparator_,local_88->file_size);
    std::__cxx11::string::append((char *)this);
    InternalKey::DebugString_abi_cxx11_(&local_a8);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::append((char *)this);
    InternalKey::DebugString_abi_cxx11_(&local_c8);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  std::__cxx11::string::append((char *)this);
  return this;
}

Assistant:

std::string VersionEdit::DebugString() const {
  std::string r;
  r.append("VersionEdit {");
  if (has_comparator_) {
    r.append("\n  Comparator: ");
    r.append(comparator_);
  }
  if (has_log_number_) {
    r.append("\n  LogNumber: ");
    AppendNumberTo(&r, log_number_);
  }
  if (has_prev_log_number_) {
    r.append("\n  PrevLogNumber: ");
    AppendNumberTo(&r, prev_log_number_);
  }
  if (has_next_file_number_) {
    r.append("\n  NextFile: ");
    AppendNumberTo(&r, next_file_number_);
  }
  if (has_last_sequence_) {
    r.append("\n  LastSeq: ");
    AppendNumberTo(&r, last_sequence_);
  }
  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    r.append("\n  CompactPointer: ");
    AppendNumberTo(&r, compact_pointers_[i].first);
    r.append(" ");
    r.append(compact_pointers_[i].second.DebugString());
  }
  for (const auto& deleted_files_kvp : deleted_files_) {
    r.append("\n  DeleteFile: ");
    AppendNumberTo(&r, deleted_files_kvp.first);
    r.append(" ");
    AppendNumberTo(&r, deleted_files_kvp.second);
  }
  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    r.append("\n  AddFile: ");
    AppendNumberTo(&r, new_files_[i].first);
    r.append(" ");
    AppendNumberTo(&r, f.number);
    r.append(" ");
    AppendNumberTo(&r, f.file_size);
    r.append(" ");
    r.append(f.smallest.DebugString());
    r.append(" .. ");
    r.append(f.largest.DebugString());
  }
  r.append("\n}\n");
  return r;
}